

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::ISXDDataEssenceDescriptor::ISXDDataEssenceDescriptor
          (ISXDDataEssenceDescriptor *this,Dictionary *d)

{
  byte_t *value;
  UL local_48;
  Dictionary *local_18;
  Dictionary *d_local;
  ISXDDataEssenceDescriptor *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  GenericDataEssenceDescriptor::GenericDataEssenceDescriptor
            (&this->super_GenericDataEssenceDescriptor,d);
  (this->super_GenericDataEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor.
  super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__ISXDDataEssenceDescriptor_0033bc68;
  ISO8String::ISO8String(&this->NamespaceURI);
  if ((this->super_GenericDataEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor.
      super_InterchangeObject.m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_GenericDataEssenceDescriptor).super_FileDescriptor.
                           super_GenericDescriptor.super_InterchangeObject.m_Dict,
                           MDD_ISXDDataEssenceDescriptor);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_GenericDataEssenceDescriptor).super_FileDescriptor.
                   super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.m_UL,&local_48);
    UL::~UL(&local_48);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x1355,
                "ASDCP::MXF::ISXDDataEssenceDescriptor::ISXDDataEssenceDescriptor(const Dictionary *)"
               );
}

Assistant:

ISXDDataEssenceDescriptor::ISXDDataEssenceDescriptor(const Dictionary* d) : GenericDataEssenceDescriptor(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_ISXDDataEssenceDescriptor);
}